

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O0

void Sbd_ManCutExpand(Gia_Man_t *p,Vec_Int_t *vMirrors,Vec_Int_t *vLutLevs,Vec_Int_t *vCut)

{
  int iVar1;
  undefined4 local_2c;
  int Entry;
  int i;
  Vec_Int_t *vCut_local;
  Vec_Int_t *vLutLevs_local;
  Vec_Int_t *vMirrors_local;
  Gia_Man_t *p_local;
  
  do {
    for (local_2c = 0; iVar1 = Vec_IntSize(vCut), local_2c < iVar1; local_2c = local_2c + 1) {
      iVar1 = Vec_IntEntry(vCut,local_2c);
      iVar1 = Sbd_ManCutExpandOne(p,vMirrors,vLutLevs,vCut,local_2c,iVar1);
      if (iVar1 != 0) break;
    }
    iVar1 = Vec_IntSize(vCut);
    if (iVar1 <= local_2c) {
      return;
    }
  } while( true );
}

Assistant:

void Sbd_ManCutExpand( Gia_Man_t * p, Vec_Int_t * vMirrors, Vec_Int_t * vLutLevs, Vec_Int_t * vCut )
{
    int i, Entry;
    do
    {
        Vec_IntForEachEntry( vCut, Entry, i )
            if ( Sbd_ManCutExpandOne( p, vMirrors, vLutLevs, vCut, i, Entry ) )
                break;
    } 
    while ( i < Vec_IntSize(vCut) );
}